

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void kj::ArrayDisposer::Dispose_<kj::MainBuilder::Impl::Arg>::destruct(void *ptr)

{
  long *plVar1;
  
  plVar1 = *(long **)((long)ptr + 0x18);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)((long)ptr + 0x18) = 0;
    (**(code **)**(undefined8 **)((long)ptr + 0x10))
              (*(undefined8 **)((long)ptr + 0x10),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }